

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo.c
# Opt level: O3

undo_rec * new_undo_record(void)

{
  undo_rec *puVar1;
  undo_rec **ppuVar2;
  undo_rec *puVar3;
  undo_rec *puVar4;
  
  puVar3 = undo_free.tqh_first;
  if (undo_free.tqh_first == (undo_rec *)0x0) {
    puVar3 = (undo_rec *)malloc(0x40);
    if (puVar3 == (undo_rec *)0x0) {
      panic("Out of memory in undo code (record)");
    }
  }
  else {
    puVar1 = ((undo_free.tqh_first)->next).tqe_next;
    ppuVar2 = ((undo_free.tqh_first)->next).tqe_prev;
    puVar4 = (undo_rec *)&undo_free;
    if (puVar1 != (undo_rec *)0x0) {
      puVar4 = puVar1;
    }
    (puVar4->next).tqe_prev = ppuVar2;
    *ppuVar2 = puVar1;
    undo_free_num = undo_free_num + -1;
  }
  *(undefined8 *)&puVar3->pos = 0;
  puVar3->content = (char *)0x0;
  (puVar3->region).r_offset = 0;
  (puVar3->region).r_lineno = 0;
  *(undefined8 *)&(puVar3->region).r_size = 0;
  *(undefined8 *)&puVar3->type = 0;
  (puVar3->region).r_linep = (line *)0x0;
  (puVar3->next).tqe_next = (undo_rec *)0x0;
  (puVar3->next).tqe_prev = (undo_rec **)0x0;
  return puVar3;
}

Assistant:

static struct undo_rec *
new_undo_record(void)
{
	struct undo_rec *rec;

	rec = TAILQ_FIRST(&undo_free);
	if (rec != NULL) {
		/* Remove it from the free-list */
		TAILQ_REMOVE(&undo_free, rec, next);
		undo_free_num--;
	} else {
		if ((rec = malloc(sizeof(*rec))) == NULL)
			panic("Out of memory in undo code (record)");
	}
	memset(rec, 0, sizeof(struct undo_rec));

	return (rec);
}